

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_openssl.cpp
# Opt level: O0

QSslCertificate QTlsPrivate::X509CertificateOpenSSL::certificateFromX509(X509 *x509)

{
  X509CertificateOpenSSL *pXVar1;
  ASN1_TIME *pAVar2;
  X509CertificateOpenSSL *this;
  X509 *pXVar3;
  long lVar4;
  ASN1_INTEGER *this_00;
  long in_RSI;
  QExplicitlySharedDataPointer<QSslCertificatePrivate> in_RDI;
  long in_FS_OFFSET;
  int a;
  ASN1_INTEGER *serialNumber;
  ASN1_TIME *naft;
  ASN1_TIME *nbef;
  X509CertificateOpenSSL *backend;
  QSslCertificate *certificate;
  QByteArray hexString;
  QSslCertificatePrivate *this_01;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  int iVar5;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined1 local_a0 [24];
  undefined1 local_88 [24];
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 local_58 [40];
  QDateTime local_30 [8];
  QDateTime local_28 [8];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)in_RDI.d.ptr = 0xaaaaaaaaaaaaaaaa;
  this_01 = (QSslCertificatePrivate *)in_RDI.d.ptr;
  QByteArray::QByteArray((QByteArray *)0x138a9e);
  QSslCertificate::QSslCertificate((QSslCertificate *)this_01,(QByteArray *)local_20,Pem);
  QByteArray::~QByteArray((QByteArray *)0x138abf);
  pXVar1 = QTlsBackend::backend<QTlsPrivate::X509CertificateOpenSSL,QSslCertificate>
                     ((QSslCertificate *)0x138ac9);
  if ((pXVar1 != (X509CertificateOpenSSL *)0x0) && (in_RSI != 0)) {
    pAVar2 = q_X509_getm_notBefore((X509 *)in_RDI.d.ptr);
    if (pAVar2 != (ASN1_TIME *)0x0) {
      anon_unknown_2::dateTimeFromASN1
                ((ASN1_TIME *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      QDateTime::operator=((QDateTime *)this_01,(QDateTime *)in_RDI.d.ptr);
      QDateTime::~QDateTime(local_28);
    }
    this = (X509CertificateOpenSSL *)q_X509_getm_notAfter((X509 *)in_RDI.d.ptr);
    if (this != (X509CertificateOpenSSL *)0x0) {
      anon_unknown_2::dateTimeFromASN1
                ((ASN1_TIME *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      QDateTime::operator=((QDateTime *)this_01,(QDateTime *)in_RDI.d.ptr);
      QDateTime::~QDateTime(local_30);
    }
    (pXVar1->super_X509CertificateBase).null = false;
    pXVar3 = q_X509_dup((X509 *)in_RDI.d.ptr);
    pXVar1->x509 = pXVar3;
    q_X509_get_issuer_name((X509 *)in_RDI.d.ptr);
    anon_unknown_2::mapFromX509Name
              ((X509_NAME *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    QMultiMap<QByteArray,_QString>::operator=
              ((QMultiMap<QByteArray,_QString> *)this_01,
               (QMultiMap<QByteArray,_QString> *)in_RDI.d.ptr);
    QMultiMap<QByteArray,_QString>::~QMultiMap((QMultiMap<QByteArray,_QString> *)0x138be4);
    q_X509_get_subject_name((X509 *)in_RDI.d.ptr);
    anon_unknown_2::mapFromX509Name
              ((X509_NAME *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    QMultiMap<QByteArray,_QString>::operator=
              ((QMultiMap<QByteArray,_QString> *)this_01,
               (QMultiMap<QByteArray,_QString> *)in_RDI.d.ptr);
    QMultiMap<QByteArray,_QString>::~QMultiMap((QMultiMap<QByteArray,_QString> *)0x138c21);
    lVar4 = q_X509_get_version((X509 *)in_RDI.d.ptr);
    QByteArray::number((longlong)local_58,(int)lVar4 + 1);
    QByteArray::operator=((QByteArray *)this_01,(QByteArray *)in_RDI.d.ptr);
    QByteArray::~QByteArray((QByteArray *)0x138c67);
    this_00 = q_X509_get_serialNumber((X509 *)in_RDI.d.ptr);
    if (this_00 != (ASN1_INTEGER *)0x0) {
      local_70 = 0xaaaaaaaaaaaaaaaa;
      local_68 = 0xaaaaaaaaaaaaaaaa;
      local_60 = 0xaaaaaaaaaaaaaaaa;
      QByteArray::QByteArray((QByteArray *)0x138cbc);
      QByteArray::reserve((QByteArray *)this_00,
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      for (iVar5 = 0; iVar5 < this_00->length; iVar5 = iVar5 + 1) {
        QByteArray::number((int)local_a0,(uint)this_00->data[iVar5]);
        QByteArray::rightJustified((longlong)local_88,(char)local_a0,true);
        QByteArray::operator+=((QByteArray *)this_01,(QByteArray *)in_RDI.d.ptr);
        QByteArray::~QByteArray((QByteArray *)0x138d46);
        QByteArray::~QByteArray((QByteArray *)0x138d50);
        QByteArray::operator+=((QByteArray *)this_01,(char)((ulong)in_RDI.d.ptr >> 0x38));
      }
      QByteArray::chop((longlong)&local_70);
      QByteArray::operator=
                (&(pXVar1->super_X509CertificateBase).serialNumberString,(QByteArray *)&local_70);
      QByteArray::~QByteArray((QByteArray *)0x138da7);
    }
    parseExtensions(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QExplicitlySharedDataPointer<QSslCertificatePrivate>)
           (QExplicitlySharedDataPointer<QSslCertificatePrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QSslCertificate X509CertificateOpenSSL::certificateFromX509(X509 *x509)
{
    QSslCertificate certificate;

    auto *backend = QTlsBackend::backend<X509CertificateOpenSSL>(certificate);
    if (!backend || !x509)
        return certificate;

    ASN1_TIME *nbef = q_X509_getm_notBefore(x509);
    if (nbef)
        backend->notValidBefore = dateTimeFromASN1(nbef);

    ASN1_TIME *naft = q_X509_getm_notAfter(x509);
    if (naft)
        backend->notValidAfter = dateTimeFromASN1(naft);

    backend->null = false;
    backend->x509 = q_X509_dup(x509);

    backend->issuerInfoEntries = mapFromX509Name(q_X509_get_issuer_name(x509));
    backend->subjectInfoEntries = mapFromX509Name(q_X509_get_subject_name(x509));
    backend->versionString = QByteArray::number(qlonglong(q_X509_get_version(x509)) + 1);

    if (ASN1_INTEGER *serialNumber = q_X509_get_serialNumber(x509)) {
        QByteArray hexString;
        hexString.reserve(serialNumber->length * 3);
        for (int a = 0; a < serialNumber->length; ++a) {
            hexString += QByteArray::number(serialNumber->data[a], 16).rightJustified(2, '0');
            hexString += ':';
        }
        hexString.chop(1);
        backend->serialNumberString = hexString;
    }

    backend->parseExtensions();

    return certificate;
}